

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

void __thiscall
kj::StringTree::fill<capnp::(anonymous_namespace)::Indent,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,Indent *rest,
          ArrayPtr<const_char> *rest_1)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Branch *pBVar4;
  char *pcVar5;
  ulong __n;
  
  pcVar5 = (char *)(this->text).content.size_;
  pBVar1 = (this->branches).ptr;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (this->text).content.ptr;
  }
  pBVar1[branchIndex].index = (long)pos - (long)pcVar5;
  pBVar1[branchIndex].content.size_ = first->size_;
  pcVar5 = pBVar1[branchIndex].content.text.content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar2 = pBVar1[branchIndex].content.text.content.size_;
    pBVar1[branchIndex].content.text.content.ptr = (char *)0x0;
    pBVar1[branchIndex].content.text.content.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.text.content.disposer;
    (*(code *)**(undefined8 **)pAVar3)(pAVar3,pcVar5,1,sVar2,sVar2,0);
  }
  pBVar1[branchIndex].content.text.content.ptr = (first->text).content.ptr;
  pBVar1[branchIndex].content.text.content.size_ = (first->text).content.size_;
  pBVar1[branchIndex].content.text.content.disposer = (first->text).content.disposer;
  (first->text).content.ptr = (char *)0x0;
  (first->text).content.size_ = 0;
  pBVar4 = pBVar1[branchIndex].content.branches.ptr;
  if (pBVar4 != (Branch *)0x0) {
    sVar2 = pBVar1[branchIndex].content.branches.size_;
    pBVar1[branchIndex].content.branches.ptr = (Branch *)0x0;
    pBVar1[branchIndex].content.branches.size_ = 0;
    pAVar3 = pBVar1[branchIndex].content.branches.disposer;
    (*(code *)**(undefined8 **)pAVar3)
              (pAVar3,pBVar4,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  pBVar1[branchIndex].content.branches.ptr = (first->branches).ptr;
  pBVar1[branchIndex].content.branches.size_ = (first->branches).size_;
  pBVar1[branchIndex].content.branches.disposer = (first->branches).disposer;
  (first->branches).ptr = (Branch *)0x0;
  (first->branches).size_ = 0;
  __n = (ulong)rest->amount;
  if (__n != 0) {
    memset(pos,0x20,__n);
    pos = pos + __n;
  }
  if (rest_1->size_ != 0) {
    memcpy(pos,rest_1->ptr,rest_1->size_);
    return;
  }
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}